

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_2.cpp
# Opt level: O2

bool is_valid(Date *d)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  if (d->y < 1) {
    return false;
  }
  uVar1 = d->m;
  uVar2 = d->d;
  if ((int)uVar2 < 1 || 0xb < uVar1 - 1) {
    return false;
  }
  if (uVar1 < 0xc) {
    if ((0xa50U >> (uVar1 & 0x1f) & 1) != 0) {
      if (uVar2 < 0x1f) {
        return true;
      }
      goto LAB_001023e2;
    }
    if (uVar1 != 2) goto LAB_001023d6;
  }
  else {
LAB_001023d6:
    if (uVar2 < 0x20) {
      return true;
    }
    if (uVar1 != 2) goto LAB_001023e2;
  }
  bVar3 = is_leap(d);
  if (bVar3 && uVar2 < 0x1e) {
    return true;
  }
LAB_001023e2:
  return uVar2 < 0x1d;
}

Assistant:

bool is_valid(const Date& d)
{
	bool is_valid = d.y > 0 && (d.m > 0 && d.m < 13) && d.d > 0;
	is_valid = is_valid && (
		(is_31_day_month(d.m) && d.d < 32) ||
		(is_30_day_month(d.m) && d.d < 31) ||
		(d.m == 2 && (is_leap(d) && d.d < 30) || d.d < 29)
		);
	return is_valid;
}